

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int nodeAcquire(Rtree *pRtree,i64 iNode,RtreeNode *pParent,RtreeNode **ppNode)

{
  sqlite3_blob *pBlob_00;
  int iVar1;
  int iVar2;
  RtreeNode *pNode_00;
  char *zTable;
  char *zTab;
  sqlite3_blob *pBlob;
  RtreeNode *pNode;
  int rc;
  RtreeNode **ppNode_local;
  RtreeNode *pParent_local;
  i64 iNode_local;
  Rtree *pRtree_local;
  
  pNode._4_4_ = 0;
  pNode_00 = nodeHashLookup(pRtree,iNode);
  if (pNode_00 == (RtreeNode *)0x0) {
    if (pRtree->pNodeBlob != (sqlite3_blob *)0x0) {
      pBlob_00 = pRtree->pNodeBlob;
      pRtree->pNodeBlob = (sqlite3_blob *)0x0;
      pNode._4_4_ = sqlite3_blob_reopen(pBlob_00,iNode);
      pRtree->pNodeBlob = pBlob_00;
      if ((pNode._4_4_ != 0) && (nodeBlobReset(pRtree), pNode._4_4_ == 7)) {
        return 7;
      }
    }
    if (pRtree->pNodeBlob == (sqlite3_blob *)0x0) {
      zTable = sqlite3_mprintf("%s_node",pRtree->zName);
      if (zTable == (char *)0x0) {
        return 7;
      }
      pNode._4_4_ = sqlite3_blob_open(pRtree->db,pRtree->zDb,zTable,"data",iNode,0,
                                      &pRtree->pNodeBlob);
      sqlite3_free(zTable);
    }
    pBlob = (sqlite3_blob *)0x0;
    if (pNode._4_4_ == 0) {
      iVar1 = pRtree->iNodeSize;
      iVar2 = sqlite3_blob_bytes(pRtree->pNodeBlob);
      if (iVar1 == iVar2) {
        pBlob = (sqlite3_blob *)sqlite3_malloc64((long)pRtree->iNodeSize + 0x28);
        if (pBlob == (sqlite3_blob *)0x0) {
          pNode._4_4_ = 7;
        }
        else {
          *(RtreeNode **)pBlob = pParent;
          *(sqlite3_blob **)(pBlob + 0x18) = pBlob + 0x28;
          *(undefined4 *)(pBlob + 0x10) = 1;
          pRtree->nNodeRef = pRtree->nNodeRef + 1;
          *(i64 *)(pBlob + 8) = iNode;
          *(undefined4 *)(pBlob + 0x14) = 0;
          *(undefined8 *)(pBlob + 0x20) = 0;
          pNode._4_4_ = sqlite3_blob_read(pRtree->pNodeBlob,*(void **)(pBlob + 0x18),
                                          pRtree->iNodeSize,0);
        }
      }
    }
    else {
      nodeBlobReset(pRtree);
      *ppNode = (RtreeNode *)0x0;
      if (pNode._4_4_ == 1) {
        pNode._4_4_ = 0x10b;
      }
    }
    if ((pBlob != (sqlite3_blob *)0x0) && (iNode == 1)) {
      iVar1 = readInt16(*(u8 **)(pBlob + 0x18));
      pRtree->iDepth = iVar1;
      if (0x28 < pRtree->iDepth) {
        pNode._4_4_ = 0x10b;
      }
    }
    if (((pBlob != (sqlite3_blob *)0x0) && (pNode._4_4_ == 0)) &&
       (iVar1 = readInt16((u8 *)(*(long *)(pBlob + 0x18) + 2)),
       (pRtree->iNodeSize + -4) / (int)(uint)pRtree->nBytesPerCell < iVar1)) {
      pNode._4_4_ = 0x10b;
    }
    if (pNode._4_4_ == 0) {
      if (pBlob == (sqlite3_blob *)0x0) {
        pNode._4_4_ = 0x10b;
      }
      else {
        nodeReference(pParent);
        nodeHashInsert(pRtree,(RtreeNode *)pBlob);
      }
      *ppNode = (RtreeNode *)pBlob;
    }
    else {
      if (pBlob != (sqlite3_blob *)0x0) {
        pRtree->nNodeRef = pRtree->nNodeRef - 1;
        sqlite3_free(pBlob);
      }
      *ppNode = (RtreeNode *)0x0;
    }
    pRtree_local._4_4_ = pNode._4_4_;
  }
  else {
    if ((pParent != (RtreeNode *)0x0) && (pNode_00->pParent == (RtreeNode *)0x0)) {
      iVar1 = nodeInParentChain(pNode_00,pParent);
      if (iVar1 != 0) {
        return 0x10b;
      }
      pParent->nRef = pParent->nRef + 1;
      pNode_00->pParent = pParent;
    }
    pNode_00->nRef = pNode_00->nRef + 1;
    *ppNode = pNode_00;
    pRtree_local._4_4_ = 0;
  }
  return pRtree_local._4_4_;
}

Assistant:

static int nodeAcquire(
  Rtree *pRtree,             /* R-tree structure */
  i64 iNode,                 /* Node number to load */
  RtreeNode *pParent,        /* Either the parent node or NULL */
  RtreeNode **ppNode         /* OUT: Acquired node */
){
  int rc = SQLITE_OK;
  RtreeNode *pNode = 0;

  /* Check if the requested node is already in the hash table. If so,
  ** increase its reference count and return it.
  */
  if( (pNode = nodeHashLookup(pRtree, iNode))!=0 ){
    assert( !pParent || !pNode->pParent || pNode->pParent==pParent );
    if( pParent && !pNode->pParent ){
      if( nodeInParentChain(pNode, pParent) ){
        RTREE_IS_CORRUPT(pRtree);
        return SQLITE_CORRUPT_VTAB;
      }
      pParent->nRef++;
      pNode->pParent = pParent;
    }
    pNode->nRef++;
    *ppNode = pNode;
    return SQLITE_OK;
  }

  if( pRtree->pNodeBlob ){
    sqlite3_blob *pBlob = pRtree->pNodeBlob;
    pRtree->pNodeBlob = 0;
    rc = sqlite3_blob_reopen(pBlob, iNode);
    pRtree->pNodeBlob = pBlob;
    if( rc ){
      nodeBlobReset(pRtree);
      if( rc==SQLITE_NOMEM ) return SQLITE_NOMEM;
    }
  }
  if( pRtree->pNodeBlob==0 ){
    char *zTab = sqlite3_mprintf("%s_node", pRtree->zName);
    if( zTab==0 ) return SQLITE_NOMEM;
    rc = sqlite3_blob_open(pRtree->db, pRtree->zDb, zTab, "data", iNode, 0,
                           &pRtree->pNodeBlob);
    sqlite3_free(zTab);
  }
  if( rc ){
    nodeBlobReset(pRtree);
    *ppNode = 0;
    /* If unable to open an sqlite3_blob on the desired row, that can only
    ** be because the shadow tables hold erroneous data. */
    if( rc==SQLITE_ERROR ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }else if( pRtree->iNodeSize==sqlite3_blob_bytes(pRtree->pNodeBlob) ){
    pNode = (RtreeNode *)sqlite3_malloc64(sizeof(RtreeNode)+pRtree->iNodeSize);
    if( !pNode ){
      rc = SQLITE_NOMEM;
    }else{
      pNode->pParent = pParent;
      pNode->zData = (u8 *)&pNode[1];
      pNode->nRef = 1;
      pRtree->nNodeRef++;
      pNode->iNode = iNode;
      pNode->isDirty = 0;
      pNode->pNext = 0;
      rc = sqlite3_blob_read(pRtree->pNodeBlob, pNode->zData,
                             pRtree->iNodeSize, 0);
    }
  }

  /* If the root node was just loaded, set pRtree->iDepth to the height
  ** of the r-tree structure. A height of zero means all data is stored on
  ** the root node. A height of one means the children of the root node
  ** are the leaves, and so on. If the depth as specified on the root node
  ** is greater than RTREE_MAX_DEPTH, the r-tree structure must be corrupt.
  */
  if( pNode && iNode==1 ){
    pRtree->iDepth = readInt16(pNode->zData);
    if( pRtree->iDepth>RTREE_MAX_DEPTH ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }

  /* If no error has occurred so far, check if the "number of entries"
  ** field on the node is too large. If so, set the return code to 
  ** SQLITE_CORRUPT_VTAB.
  */
  if( pNode && rc==SQLITE_OK ){
    if( NCELL(pNode)>((pRtree->iNodeSize-4)/pRtree->nBytesPerCell) ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }

  if( rc==SQLITE_OK ){
    if( pNode!=0 ){
      nodeReference(pParent);
      nodeHashInsert(pRtree, pNode);
    }else{
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
    *ppNode = pNode;
  }else{
    if( pNode ){
      pRtree->nNodeRef--;
      sqlite3_free(pNode);
    }
    *ppNode = 0;
  }

  return rc;
}